

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse.h
# Opt level: O0

void sse::common::zero<int>(int *pDst,int len)

{
  int len_local;
  int *pDst_local;
  int i;
  int local_274;
  int *local_270;
  
  local_270 = pDst;
  for (local_274 = len >> 2; 3 < local_274; local_274 = local_274 + -4) {
    local_270[0] = 0;
    local_270[1] = 0;
    local_270[2] = 0;
    local_270[3] = 0;
    local_270[4] = 0;
    local_270[5] = 0;
    local_270[6] = 0;
    local_270[7] = 0;
    local_270[8] = 0;
    local_270[9] = 0;
    local_270[10] = 0;
    local_270[0xb] = 0;
    local_270[0xc] = 0;
    local_270[0xd] = 0;
    local_270[0xe] = 0;
    local_270[0xf] = 0;
    local_270 = local_270 + 0x10;
  }
  if (1 < local_274) {
    local_270[0] = 0;
    local_270[1] = 0;
    local_270[2] = 0;
    local_270[3] = 0;
    local_270[4] = 0;
    local_270[5] = 0;
    local_270[6] = 0;
    local_270[7] = 0;
    local_274 = local_274 + -2;
    local_270 = local_270 + 8;
  }
  if (local_274 != 0) {
    local_270[0] = 0;
    local_270[1] = 0;
    local_270[2] = 0;
    local_270[3] = 0;
  }
  for (pDst_local._4_4_ = len - (len & 3U); pDst_local._4_4_ < len;
      pDst_local._4_4_ = pDst_local._4_4_ + 1) {
    pDst[pDst_local._4_4_] = 0;
  }
  return;
}

Assistant:

_SIMD_SSE_T void zero(_T* pDst, int len)
        {
            set<_T>((_T)0, pDst, len);
        }